

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O3

void UpsampleRgb565LinePair_C
               (uint8_t *top_y,uint8_t *bottom_y,uint8_t *top_u,uint8_t *top_v,uint8_t *cur_u,
               uint8_t *cur_v,uint8_t *top_dst,uint8_t *bottom_dst,int len)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  
  lVar14 = (long)len - 1;
  uVar3 = (int)lVar14 >> 1;
  uVar21 = (uint)*top_v << 0x10 | (uint)*top_u;
  uVar20 = (uint)*cur_v << 0x10 | (uint)*cur_u;
  uVar15 = uVar21 * 3 + uVar20 + 0x20002;
  uVar18 = uVar15 >> 2 & 0xff;
  uVar15 = uVar15 >> 0x12;
  uVar13 = (uint)*top_y * 0x4a85 >> 8;
  uVar6 = (uVar15 * 0x6625 >> 8) + uVar13;
  uVar5 = 0;
  uVar7 = uVar6 - 0x379a;
  uVar22 = 0xf8;
  if (uVar6 < 0x379a) {
    uVar22 = uVar5;
  }
  bVar17 = (byte)(uVar7 >> 6);
  if (0x3fff < uVar7) {
    bVar17 = (byte)uVar22;
  }
  iVar16 = (uVar15 * 0x3408 >> 8) + (uVar18 * 0x1913 >> 8);
  uVar6 = (uVar13 - iVar16) + 0x2204;
  uVar22 = 0xff;
  if ((int)(uVar13 - iVar16) < -0x2204) {
    uVar22 = uVar5;
  }
  if (uVar6 < 0x4000) {
    uVar22 = uVar6 >> 6;
  }
  uVar13 = (uVar18 * 0x811a >> 8) + uVar13;
  uVar7 = uVar13 - 0x4515;
  uVar6 = 0x1f;
  if (uVar13 < 0x4515) {
    uVar6 = uVar5;
  }
  bVar9 = (byte)(uVar7 >> 9);
  if (0x3fff < uVar7) {
    bVar9 = (byte)uVar6;
  }
  *top_dst = (byte)(uVar22 >> 5) | bVar17 & 0xf8;
  top_dst[1] = (byte)((uVar22 & 0x1c) << 3) | bVar9;
  if (bottom_y != (uint8_t *)0x0) {
    uVar6 = uVar21 + uVar20 * 3 + 0x20002;
    uVar15 = uVar6 >> 2 & 0xff;
    uVar6 = uVar6 >> 0x12;
    uVar18 = (uint)*bottom_y * 0x4a85 >> 8;
    uVar7 = (uVar6 * 0x6625 >> 8) + uVar18;
    uVar13 = uVar7 - 0x379a;
    uVar22 = 0xf8;
    if (uVar7 < 0x379a) {
      uVar22 = uVar5;
    }
    bVar17 = (byte)(uVar13 >> 6);
    if (0x3fff < uVar13) {
      bVar17 = (byte)uVar22;
    }
    iVar16 = (uVar6 * 0x3408 >> 8) + (uVar15 * 0x1913 >> 8);
    uVar6 = (uVar18 - iVar16) + 0x2204;
    uVar22 = 0xff;
    if ((int)(uVar18 - iVar16) < -0x2204) {
      uVar22 = uVar5;
    }
    if (uVar6 < 0x4000) {
      uVar22 = uVar6 >> 6;
    }
    uVar18 = (uVar15 * 0x811a >> 8) + uVar18;
    uVar7 = uVar18 - 0x4515;
    uVar6 = 0x1f;
    if (uVar18 < 0x4515) {
      uVar6 = uVar5;
    }
    bVar9 = (byte)(uVar7 >> 9);
    if (0x3fff < uVar7) {
      bVar9 = (byte)uVar6;
    }
    *bottom_dst = (byte)(uVar22 >> 5) | bVar17 & 0xf8;
    bottom_dst[1] = (byte)((uVar22 & 0x1c) << 3) | bVar9;
  }
  if (0 < (int)uVar3) {
    uVar8 = 0;
    uVar22 = uVar21;
    uVar5 = uVar20;
    do {
      uVar21 = (uint)top_v[uVar8 + 1] << 0x10 | (uint)top_u[uVar8 + 1];
      uVar20 = (uint)cur_v[uVar8 + 1] << 0x10 | (uint)cur_u[uVar8 + 1];
      iVar16 = uVar22 + uVar5 + uVar21 + uVar20;
      uVar15 = iVar16 + (uVar21 + uVar5) * 2 + 0x80008 >> 3;
      uVar6 = uVar15 + uVar22;
      uVar10 = uVar6 >> 0x11;
      uVar18 = (uint)top_y[uVar8 * 2 + 1] * 0x4a85 >> 8;
      uVar7 = (uVar10 * 0x6625 >> 8) + uVar18;
      bVar17 = 0;
      uVar13 = uVar7 - 0x379a;
      if (0x3799 < uVar7) {
        bVar17 = 0xf8;
      }
      uVar6 = uVar6 >> 1 & 0xff;
      bVar9 = (byte)(uVar13 >> 6);
      if (0x3fff < uVar13) {
        bVar9 = bVar17;
      }
      iVar4 = uVar18 - ((uVar10 * 0x3408 >> 8) + (uVar6 * 0x1913 >> 8));
      uVar19 = 0;
      if (-0x2205 < iVar4) {
        uVar19 = 0xff;
      }
      uVar7 = iVar4 + 0x2204;
      uVar11 = (ulong)(uVar7 >> 6);
      if (0x3fff < uVar7) {
        uVar11 = uVar19;
      }
      uVar18 = (uVar6 * 0x811a >> 8) + uVar18;
      bVar17 = 0;
      uVar6 = uVar18 - 0x4515;
      if (0x4514 < uVar18) {
        bVar17 = 0x1f;
      }
      uVar22 = iVar16 + (uVar22 + uVar20) * 2 + 0x80008 >> 3;
      bVar2 = (byte)(uVar6 >> 9);
      if (0x3fff < uVar6) {
        bVar2 = bVar17;
      }
      uVar6 = uVar22 + uVar21;
      top_dst[uVar8 * 4 + 2] = (byte)(uVar11 >> 5) | bVar9 & 0xf8;
      top_dst[uVar8 * 4 + 3] = (byte)(((uint)uVar11 & 0x1c) << 3) | bVar2;
      uVar10 = uVar6 >> 0x11;
      uVar7 = (uint)top_y[uVar8 * 2 + 2] * 0x4a85 >> 8;
      uVar13 = (uVar10 * 0x6625 >> 8) + uVar7;
      bVar17 = 0;
      uVar18 = uVar13 - 0x379a;
      if (0x3799 < uVar13) {
        bVar17 = 0xf8;
      }
      uVar6 = uVar6 >> 1 & 0xff;
      bVar9 = (byte)(uVar18 >> 6);
      if (0x3fff < uVar18) {
        bVar9 = bVar17;
      }
      iVar16 = uVar7 - ((uVar10 * 0x3408 >> 8) + (uVar6 * 0x1913 >> 8));
      uVar19 = 0;
      if (-0x2205 < iVar16) {
        uVar19 = 0xff;
      }
      uVar13 = iVar16 + 0x2204;
      uVar11 = (ulong)(uVar13 >> 6);
      if (0x3fff < uVar13) {
        uVar11 = uVar19;
      }
      uVar7 = (uVar6 * 0x811a >> 8) + uVar7;
      bVar17 = 0;
      uVar6 = uVar7 - 0x4515;
      if (0x4514 < uVar7) {
        bVar17 = 0x1f;
      }
      bVar2 = (byte)(uVar6 >> 9);
      if (0x3fff < uVar6) {
        bVar2 = bVar17;
      }
      top_dst[uVar8 * 4 + 4] = (byte)(uVar11 >> 5) | bVar9 & 0xf8;
      top_dst[uVar8 * 4 + 5] = (byte)(((uint)uVar11 & 0x1c) << 3) | bVar2;
      if (bottom_y != (uint8_t *)0x0) {
        uVar22 = uVar22 + uVar5;
        uVar5 = uVar22 >> 0x11;
        uVar6 = (uint)bottom_y[uVar8 * 2 + 1] * 0x4a85 >> 8;
        uVar7 = (uVar5 * 0x6625 >> 8) + uVar6;
        bVar9 = 0;
        bVar17 = 0;
        uVar13 = uVar7 - 0x379a;
        if (0x3799 < uVar7) {
          bVar17 = 0xf8;
        }
        uVar22 = uVar22 >> 1 & 0xff;
        bVar2 = (byte)(uVar13 >> 6);
        if (0x3fff < uVar13) {
          bVar2 = bVar17;
        }
        iVar16 = uVar6 - ((uVar5 * 0x3408 >> 8) + (uVar22 * 0x1913 >> 8));
        uVar5 = 0;
        if (-0x2205 < iVar16) {
          uVar5 = 0xff;
        }
        uVar13 = iVar16 + 0x2204;
        uVar7 = uVar13 >> 6;
        if (0x3fff < uVar13) {
          uVar7 = uVar5;
        }
        uVar6 = uVar6 + (uVar22 * 0x811a >> 8);
        bVar17 = 0;
        uVar22 = uVar6 - 0x4515;
        if (0x4514 < uVar6) {
          bVar17 = 0x1f;
        }
        uVar15 = uVar15 + uVar20;
        bVar1 = (byte)(uVar22 >> 9);
        if (0x3fff < uVar22) {
          bVar1 = bVar17;
        }
        bottom_dst[uVar8 * 4 + 2] = (byte)(uVar7 >> 5) | bVar2 & 0xf8;
        bottom_dst[uVar8 * 4 + 3] = (byte)((uVar7 & 0x1c) << 3) | bVar1;
        uVar22 = uVar15 >> 0x11;
        uVar5 = (uint)bottom_y[uVar8 * 2 + 2] * 0x4a85 >> 8;
        uVar6 = (uVar22 * 0x6625 >> 8) + uVar5;
        bVar17 = 0;
        uVar7 = uVar6 - 0x379a;
        if (0x3799 < uVar6) {
          bVar17 = 0xf8;
        }
        uVar6 = uVar15 >> 1 & 0xff;
        bVar2 = (byte)(uVar7 >> 6);
        if (0x3fff < uVar7) {
          bVar2 = bVar17;
        }
        iVar16 = uVar5 - ((uVar22 * 0x3408 >> 8) + (uVar6 * 0x1913 >> 8));
        uVar22 = 0;
        if (-0x2205 < iVar16) {
          uVar22 = 0xff;
        }
        uVar13 = iVar16 + 0x2204;
        uVar7 = uVar13 >> 6;
        if (0x3fff < uVar13) {
          uVar7 = uVar22;
        }
        uVar5 = uVar5 + (uVar6 * 0x811a >> 8);
        uVar22 = uVar5 - 0x4515;
        if (0x4514 < uVar5) {
          bVar9 = 0x1f;
        }
        bVar17 = (byte)(uVar22 >> 9);
        if (0x3fff < uVar22) {
          bVar17 = bVar9;
        }
        bottom_dst[uVar8 * 4 + 4] = (byte)(uVar7 >> 5) | bVar2 & 0xf8;
        bottom_dst[uVar8 * 4 + 5] = (byte)((uVar7 & 0x1c) << 3) | bVar17;
      }
      uVar8 = uVar8 + 1;
      uVar22 = uVar21;
      uVar5 = uVar20;
    } while (uVar3 != uVar8);
  }
  if (((long)len & 1U) == 0) {
    uVar7 = uVar20 + uVar21 * 3 + 0x20002;
    uVar5 = uVar7 >> 2 & 0xff;
    uVar7 = uVar7 >> 0x12;
    uVar6 = (uint)top_y[lVar14] * 0x4a85 >> 8;
    uVar13 = (uVar7 * 0x6625 >> 8) + uVar6;
    uVar3 = 0;
    uVar15 = uVar13 - 0x379a;
    uVar22 = 0xf8;
    if (uVar13 < 0x379a) {
      uVar22 = uVar3;
    }
    bVar17 = (byte)(uVar15 >> 6);
    if (0x3fff < uVar15) {
      bVar17 = (byte)uVar22;
    }
    iVar16 = (uVar7 * 0x3408 >> 8) + (uVar5 * 0x1913 >> 8);
    uVar7 = (uVar6 - iVar16) + 0x2204;
    uVar22 = 0xff;
    if ((int)(uVar6 - iVar16) < -0x2204) {
      uVar22 = uVar3;
    }
    if (uVar7 < 0x4000) {
      uVar22 = uVar7 >> 6;
    }
    uVar6 = (uVar5 * 0x811a >> 8) + uVar6;
    uVar7 = uVar6 - 0x4515;
    uVar5 = 0x1f;
    if (uVar6 < 0x4515) {
      uVar5 = uVar3;
    }
    bVar9 = (byte)(uVar7 >> 9);
    if (0x3fff < uVar7) {
      bVar9 = (byte)uVar5;
    }
    lVar12 = (long)(int)lVar14;
    top_dst[lVar12 * 2] = (byte)(uVar22 >> 5) | bVar17 & 0xf8;
    top_dst[lVar12 * 2 + 1] = (byte)((uVar22 & 0x1c) << 3) | bVar9;
    if (bottom_y != (uint8_t *)0x0) {
      uVar6 = uVar21 + uVar20 * 3 + 0x20002;
      uVar5 = uVar6 >> 2 & 0xff;
      uVar6 = uVar6 >> 0x12;
      uVar21 = (uint)bottom_y[lVar14] * 0x4a85 >> 8;
      uVar7 = (uVar6 * 0x6625 >> 8) + uVar21;
      uVar13 = uVar7 - 0x379a;
      uVar22 = 0xf8;
      if (uVar7 < 0x379a) {
        uVar22 = uVar3;
      }
      bVar17 = (byte)(uVar13 >> 6);
      if (0x3fff < uVar13) {
        bVar17 = (byte)uVar22;
      }
      iVar16 = (uVar6 * 0x3408 >> 8) + (uVar5 * 0x1913 >> 8);
      uVar6 = (uVar21 - iVar16) + 0x2204;
      uVar22 = 0xff;
      if ((int)(uVar21 - iVar16) < -0x2204) {
        uVar22 = uVar3;
      }
      if (uVar6 < 0x4000) {
        uVar22 = uVar6 >> 6;
      }
      uVar21 = (uVar5 * 0x811a >> 8) + uVar21;
      uVar6 = uVar21 - 0x4515;
      uVar5 = 0x1f;
      if (uVar21 < 0x4515) {
        uVar5 = uVar3;
      }
      bVar9 = (byte)(uVar6 >> 9);
      if (0x3fff < uVar6) {
        bVar9 = (byte)uVar5;
      }
      bottom_dst[lVar12 * 2] = (byte)(uVar22 >> 5) | bVar17 & 0xf8;
      bottom_dst[lVar12 * 2 + 1] = (byte)((uVar22 & 0x1c) << 3) | bVar9;
    }
  }
  return;
}

Assistant:

static void EmptyUpsampleFunc(const uint8_t* top_y, const uint8_t* bottom_y,
                              const uint8_t* top_u, const uint8_t* top_v,
                              const uint8_t* cur_u, const uint8_t* cur_v,
                              uint8_t* top_dst, uint8_t* bottom_dst, int len) {
  (void)top_y;
  (void)bottom_y;
  (void)top_u;
  (void)top_v;
  (void)cur_u;
  (void)cur_v;
  (void)top_dst;
  (void)bottom_dst;
  (void)len;
  assert(0);   // COLORSPACE SUPPORT NOT COMPILED
}